

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_3::containsSubType
               (VarType *complexType,DataType basicType)

{
  Type TVar1;
  pointer pSVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  VarType *complexType_00;
  uint uVar7;
  
  for (; TVar1 = complexType->m_type, TVar1 == TYPE_ARRAY;
      complexType = (complexType->m_data).array.elementType) {
  }
  if (TVar1 == TYPE_BASIC) {
    bVar5 = (complexType->m_data).basic.type == TYPE_UINT_ATOMIC_COUNTER;
  }
  else if (TVar1 == TYPE_STRUCT) {
    pSVar2 = (((complexType->m_data).structPtr)->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (int)((long)(((complexType->m_data).structPtr)->m_members).
                        super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) * -0x49249249
    ;
    bVar5 = 0 < (int)uVar7;
    if (0 < (int)uVar7) {
      bVar4 = containsSubType(&pSVar2->m_type,basicType);
      if (!bVar4) {
        complexType_00 = &pSVar2[1].m_type;
        uVar3 = 1;
        do {
          uVar6 = uVar3;
          if ((uVar7 & 0x7fffffff) == uVar6) break;
          bVar5 = containsSubType(complexType_00,basicType);
          complexType_00 = (VarType *)&complexType_00[2].m_data;
          uVar3 = uVar6 + 1;
        } while (!bVar5);
        bVar5 = uVar6 < (uVar7 & 0x7fffffff);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool containsSubType (const glu::VarType& complexType, glu::DataType basicType)
{
	if (complexType.isBasicType())
	{
		return complexType.getBasicType() == basicType;
	}
	else if (complexType.isArrayType())
	{
		return containsSubType(complexType.getElementType(), basicType);
	}
	else if (complexType.isStructType())
	{
		for (int ndx = 0; ndx < complexType.getStructPtr()->getNumMembers(); ++ndx)
			if (containsSubType(complexType.getStructPtr()->getMember(ndx).getType(), basicType))
				return true;
		return false;
	}
	else
	{
		DE_ASSERT(false);
		return false;
	}
}